

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void comiss_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x5000d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"comisd",7);
    }
    else {
      if ((pMyDisasm->Reserved_).NB_PREFIX != 0) goto LAB_0011bdcc;
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Instruction).Category = 0x4000d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"comiss",7);
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 == '\x01') {
    IVar2 = 0x110000;
    if (((pMyDisasm->Reserved_).EVEX.state == '\x01') &&
       (IVar2 = 0x140000, (pMyDisasm->Reserved_).EVEX.W == '\0')) goto LAB_0011bdcc;
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcomisd",8);
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
  }
  else {
    if ((UVar1 != '\0') ||
       ((IVar2 = 0x110000, (pMyDisasm->Reserved_).EVEX.state == '\x01' &&
        (IVar2 = 0x140000, (pMyDisasm->Reserved_).EVEX.W == '\x01')))) {
LAB_0011bdcc:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcomiss",8);
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
  }
  (pMyDisasm->Reserved_).Register_ = 4;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).EVEX.vvvv;
  }
  else {
    UVar1 = (pMyDisasm->Reserved_).VEX.vvvv;
  }
  if (UVar1 != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  return;
}

Assistant:

void __bea_callspec__ comiss_VW(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     if (
       (GV.EVEX.state == InUsePrefix) &&
       (GV.EVEX.W == 1)
     ) {
       failDecode(pMyDisasm);
       return;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcomiss");
     #endif
     GV.MemDecoration = Arg2dword;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.VEX.vvvv != 15)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.vvvv != 15))
       ) {
       GV.ERROR_OPCODE = UD_;
     }
   }
   else if (GV.VEX.pp == 1) {
     if (
       (GV.EVEX.state == InUsePrefix) &&
       (GV.EVEX.W == 0)
     ) {
       failDecode(pMyDisasm);
       return;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcomisd");
     #endif
     GV.MemDecoration = Arg2qword;
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     if (
         ((GV.EVEX.state != InUsePrefix) && (GV.VEX.vvvv != 15)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.vvvv != 15))
       ) {
       GV.ERROR_OPCODE = UD_;
     }
   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2qword;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+COMPARISON_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "comisd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

   }
   else if (GV.NB_PREFIX == 0) {
       GV.MemDecoration = Arg2dword;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+COMPARISON_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "comiss");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
   }
   else {
     failDecode(pMyDisasm);
   }
 }
}